

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<unsigned_int>::emplace_back<unsigned_int_const&>
          (SmallVectorBase<unsigned_int> *this,uint *args)

{
  iterator puVar1;
  uint *in_RSI;
  SmallVectorBase<unsigned_int> *in_RDI;
  uint *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<unsigned_int> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<unsigned_int_const&>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    puVar1 = end(in_RDI);
    *puVar1 = *in_RSI;
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }